

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

size_t portability_path_get_relative
                 (char *base,size_t base_size,char *path,size_t path_size,char *relative,
                 size_t relative_size)

{
  char cVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (relative == (char *)0x0 || (path == (char *)0x0 || base == (char *)0x0)) {
    return 0;
  }
  if (base_size < path_size) {
    path_size = base_size;
  }
  cVar1 = *path;
  if (*base == cVar1) {
    uVar6 = 0;
    do {
      uVar4 = uVar6;
      if ((path_size <= uVar6) || (cVar1 == '\0')) break;
      uVar4 = uVar6 + 1;
      cVar1 = path[uVar6 + 1];
      lVar2 = uVar6 + 1;
      uVar6 = uVar4;
    } while (base[lVar2] == cVar1);
  }
  else {
    uVar4 = 0;
  }
  uVar6 = uVar4 + (cVar1 == '/');
  cVar3 = path[uVar6];
  if (uVar6 < relative_size && cVar3 != '\0') {
    lVar5 = 0;
    do {
      lVar2 = lVar5 + 1;
      relative[lVar5] = cVar3;
      if (relative_size <= uVar4 + (cVar1 == '/') + 1 + lVar5) break;
      cVar3 = path[lVar5 + uVar6 + 1];
      lVar5 = lVar2;
    } while (cVar3 != '\0');
  }
  else {
    lVar2 = 0;
  }
  relative[lVar2] = '\0';
  return lVar2 + 1;
}

Assistant:

size_t portability_path_get_relative(const char *base, size_t base_size, const char *path, size_t path_size, char *relative, size_t relative_size)
{
	if (base == NULL || path == NULL || relative == NULL)
	{
		return 0;
	}

	size_t i, length = 0, size = base_size < path_size ? base_size : path_size;

	for (i = 0; base[i] == path[i] && (base[i] != '\0' || path[i] != '\0') && i < size; ++i)
		;

	if (PORTABILITY_PATH_SEPARATOR(path[i]))
	{
		++i;
	}

	for (; path[i] != '\0' && i < relative_size; ++i)
	{
		relative[length++] = path[i];
	}

	relative[length] = '\0';

	return length + 1;
}